

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lbfgsb.hpp
# Opt level: O2

int __thiscall lbfgsb::Optimizer::init(Optimizer *this,EVP_PKEY_CTX *ctx)

{
  char *pcVar1;
  pointer pdVar2;
  pointer piVar3;
  uint in_EAX;
  pointer pdVar4;
  pointer piVar5;
  long lVar6;
  undefined8 uStack_18;
  
  pdVar2 = (this->wa).super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_finish;
  for (pdVar4 = (this->wa).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_start; pdVar4 != pdVar2; pdVar4 = pdVar4 + 1) {
    *pdVar4 = 0.0;
  }
  piVar3 = (this->iwa).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
           ._M_finish;
  for (piVar5 = (this->iwa).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_start; piVar5 != piVar3; piVar5 = piVar5 + 1) {
    *piVar5 = 0;
  }
  uStack_18 = (ulong)in_EAX;
  std::__fill_a1<bool*,int>(this->lsave,(bool *)this->isave,(int *)((long)&uStack_18 + 4));
  for (lVar6 = -0xb0; lVar6 != 0; lVar6 = lVar6 + 4) {
    *(undefined4 *)((long)this->dsave + lVar6 + -4) = 0;
  }
  for (lVar6 = -0xe8; lVar6 != 0; lVar6 = lVar6 + 8) {
    pcVar1 = this[1].task + lVar6 + -0x60;
    pcVar1[0] = '\0';
    pcVar1[1] = '\0';
    pcVar1[2] = '\0';
    pcVar1[3] = '\0';
    pcVar1[4] = '\0';
    pcVar1[5] = '\0';
    pcVar1[6] = '\0';
    pcVar1[7] = '\0';
  }
  builtin_strncpy(this->csave + 4,"                                                        ",0x38);
  this->task[0x30] = ' ';
  this->task[0x31] = ' ';
  this->task[0x32] = ' ';
  this->task[0x33] = ' ';
  this->task[0x34] = ' ';
  this->task[0x35] = ' ';
  this->task[0x36] = ' ';
  this->task[0x37] = ' ';
  *(undefined8 *)(this->task + 0x38) = 0x2020202020202020;
  this->task[0x20] = ' ';
  this->task[0x21] = ' ';
  this->task[0x22] = ' ';
  this->task[0x23] = ' ';
  this->task[0x24] = ' ';
  this->task[0x25] = ' ';
  this->task[0x26] = ' ';
  this->task[0x27] = ' ';
  this->task[0x28] = ' ';
  this->task[0x29] = ' ';
  this->task[0x2a] = ' ';
  this->task[0x2b] = ' ';
  this->task[0x2c] = ' ';
  this->task[0x2d] = ' ';
  this->task[0x2e] = ' ';
  this->task[0x2f] = ' ';
  this->task[0x10] = ' ';
  this->task[0x11] = ' ';
  this->task[0x12] = ' ';
  this->task[0x13] = ' ';
  this->task[0x14] = ' ';
  this->task[0x15] = ' ';
  this->task[0x16] = ' ';
  this->task[0x17] = ' ';
  this->task[0x18] = ' ';
  this->task[0x19] = ' ';
  this->task[0x1a] = ' ';
  this->task[0x1b] = ' ';
  this->task[0x1c] = ' ';
  this->task[0x1d] = ' ';
  this->task[0x1e] = ' ';
  this->task[0x1f] = ' ';
  this->task[0] = ' ';
  this->task[1] = ' ';
  this->task[2] = ' ';
  this->task[3] = ' ';
  this->task[4] = ' ';
  this->task[5] = ' ';
  this->task[6] = ' ';
  this->task[7] = ' ';
  this->task[8] = ' ';
  this->task[9] = ' ';
  this->task[10] = ' ';
  this->task[0xb] = ' ';
  this->task[0xc] = ' ';
  this->task[0xd] = ' ';
  this->task[0xe] = ' ';
  this->task[0xf] = ' ';
  return 0x20202020;
}

Assistant:

void init() {
                // Fill with 0.
                std::fill(wa.begin(), wa.end(), 0);
                std::fill(iwa.begin(), iwa.end(), 0);
                std::fill_n(lsave, N_LSAVE, 0);
                std::fill_n(isave, N_ISAVE, 0);
                std::fill_n(dsave, N_DSAVE, 0);
                std::fill_n(task, N_TASK, ' ');
                std::fill_n(csave, N_CSAVE, ' ');
            }